

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O2

void __thiscall
ktx::CommandCreate::generateMipLevels
          (CommandCreate *this,KTXTexture2 *texture,
          unique_ptr<Image,_std::default_delete<Image>_> *image,ImageInput *inputFile,
          uint32_t numMipLevels,uint32_t layerIndex,uint32_t faceIndex,uint32_t depthSliceIndex)

{
  Image *pIVar1;
  _Head_base<0UL,_Image_*,_false> _Var2;
  bool bVar3;
  uint uVar4;
  ktx_error_code_e kVar5;
  VkFormat format;
  uint uVar6;
  ktx_uint32_t kVar7;
  _Head_base<0UL,_Image_*,_false> local_90;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_80;
  uint32_t local_7c;
  KTXTexture2 *local_78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> imageData;
  
  local_80 = layerIndex;
  local_7c = numMipLevels;
  local_78 = texture;
  bVar3 = isFormatINT(texture->handle_->vkFormat);
  if (bVar3) {
    toString_abi_cxx11_((string *)&imageData,(ktx *)(ulong)local_78->handle_->vkFormat,format);
    Reporter::fatal<char_const(&)[63],std::__cxx11::string>
              (&(this->super_Command).super_Reporter,NOT_SUPPORTED,
               (char (*) [63])"Mipmap generation for SINT or UINT format {} is not supported.",
               (string *)&imageData);
    std::__cxx11::string::~string((string *)&imageData);
  }
  pIVar1 = (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
           super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
           super__Head_base<0UL,_Image_*,_false>._M_head_impl;
  local_84 = pIVar1->width;
  local_88 = pIVar1->height;
  kVar7 = 1;
  while( true ) {
    if (local_7c <= kVar7) {
      return;
    }
    pIVar1 = (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
             super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
             super__Head_base<0UL,_Image_*,_false>._M_head_impl;
    std::optional<std::__cxx11::string>::value_or<std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&imageData,
               (optional<std::__cxx11::string> *)&(this->options).super_OptionsCreate.mipmapFilter,
               &(this->options).super_OptionsCreate.defaultMipmapFilter);
    uVar4 = local_88 >> ((byte)kVar7 & 0x1f);
    uVar6 = local_84 >> ((byte)kVar7 & 0x1f);
    (*pIVar1->_vptr_Image[0x11])
              ((&(this->options).super_OptionsCreate.mipmapFilterScale)
               [(this->options).super_OptionsCreate.mipmapFilterScale.
                super__Optional_base<float,_true,_true>._M_payload.
                super__Optional_payload_base<float>._M_engaged ^ 1].
               super__Optional_base<float,_true,_true>._M_payload.
               super__Optional_payload_base<float>._M_payload._M_value,&local_90,pIVar1,
               (ulong)(uVar6 + (uVar6 == 0)),(ulong)(uVar4 + (uVar4 == 0)),
               imageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (ulong)(&(this->options).super_OptionsCreate.mipmapWrap)
                      [(this->options).super_OptionsCreate.mipmapWrap.
                       super__Optional_base<basisu::Resampler::Boundary_Op,_true,_true>._M_payload.
                       super__Optional_payload_base<basisu::Resampler::Boundary_Op>._M_engaged ^ 1].
                      super__Optional_base<basisu::Resampler::Boundary_Op,_true,_true>._M_payload.
                      super__Optional_payload_base<basisu::Resampler::Boundary_Op>._M_payload.
                      _M_value);
    _Var2._M_head_impl = local_90._M_head_impl;
    local_90._M_head_impl = (Image *)0x0;
    pIVar1 = (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
             super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
             super__Head_base<0UL,_Image_*,_false>._M_head_impl;
    (image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
    super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
    super__Head_base<0UL,_Image_*,_false>._M_head_impl = _Var2._M_head_impl;
    if (pIVar1 != (Image *)0x0) {
      (*pIVar1->_vptr_Image[1])();
      if (local_90._M_head_impl != (Image *)0x0) {
        (*(local_90._M_head_impl)->_vptr_Image[1])();
      }
    }
    local_90._M_head_impl = (Image *)0x0;
    std::__cxx11::string::~string((string *)&imageData);
    if ((this->options).super_OptionsCreate.normalize == true) {
      (*((image->_M_t).super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
         super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
         super__Head_base<0UL,_Image_*,_false>._M_head_impl)->_vptr_Image[0x14])();
    }
    convert(&imageData,this,image,(this->options).super_OptionsCreate.vkFormat,inputFile);
    kVar5 = (*local_78->handle_->vtbl->SetImageFromMemory)
                      ((ktxTexture *)local_78->handle_,kVar7,local_80,faceIndex + depthSliceIndex,
                       imageData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       (long)imageData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)imageData.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (kVar5 != KTX_SUCCESS) break;
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&imageData);
    kVar7 = kVar7 + 1;
  }
  __assert_fail("ret == KTX_SUCCESS && \"Internal error\"",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_create.cpp"
                ,0x9f7,
                "void ktx::CommandCreate::generateMipLevels(KTXTexture2 &, std::unique_ptr<Image>, ImageInput &, uint32_t, uint32_t, uint32_t, uint32_t)"
               );
}

Assistant:

void CommandCreate::generateMipLevels(KTXTexture2& texture, std::unique_ptr<Image> image, ImageInput& inputFile,
        uint32_t numMipLevels, uint32_t layerIndex, uint32_t faceIndex, uint32_t depthSliceIndex) {

    if (isFormatINT(static_cast<VkFormat>(texture->vkFormat)))
        fatal(rc::NOT_SUPPORTED, "Mipmap generation for SINT or UINT format {} is not supported.",
              toString(static_cast<VkFormat>(texture->vkFormat)));

    const auto baseWidth = image->getWidth();
    const auto baseHeight = image->getHeight();

    for (uint32_t mipLevelIndex = 1; mipLevelIndex < numMipLevels; ++mipLevelIndex) {
        const auto mipImageWidth = std::max(1u, baseWidth >> (mipLevelIndex));
        const auto mipImageHeight = std::max(1u, baseHeight >> (mipLevelIndex));

        try {
            image = image->resample(mipImageWidth, mipImageHeight,
                    options.mipmapFilter.value_or(options.defaultMipmapFilter).c_str(),
                    options.mipmapFilterScale.value_or(options.defaultMipmapFilterScale),
                    options.mipmapWrap.value_or(options.defaultMipmapWrap));
        } catch (const std::exception& e) {
            fatal(rc::RUNTIME_ERROR, "Mipmap generation failed: {}", e.what());
        }

        if (options.normalize)
            image->normalize();

        const auto imageData = convert(image, options.vkFormat, inputFile);

        const auto ret = ktxTexture_SetImageFromMemory(
                texture,
                mipLevelIndex,
                layerIndex,
                faceIndex + depthSliceIndex, // Faces and Depths are mutually exclusive, Addition is acceptable
                imageData.data(),
                imageData.size());
        assert(ret == KTX_SUCCESS && "Internal error"); (void) ret;
    }
}